

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O2

void __thiscall
GEO::VariableObserverList::notify_observers(VariableObserverList *this,string *value)

{
  pointer ppVVar1;
  VariableObserver *pVVar2;
  size_t i;
  ulong uVar3;
  
  if (this->block_notify_ == false) {
    this->block_notify_ = true;
    uVar3 = 0;
    while( true ) {
      ppVVar1 = (this->observers_).
                super__Vector_base<GEO::VariableObserver_*,_std::allocator<GEO::VariableObserver_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->observers_).
                        super__Vector_base<GEO::VariableObserver_*,_std::allocator<GEO::VariableObserver_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppVVar1 >> 3) <= uVar3)
      break;
      pVVar2 = ppVVar1[uVar3];
      (**pVVar2->_vptr_VariableObserver)(pVVar2,value);
      uVar3 = uVar3 + 1;
    }
    this->block_notify_ = false;
  }
  return;
}

Assistant:

void VariableObserverList::notify_observers(
        const std::string& value
    ) {
        if(block_notify_) {
            return;
        }
        block_notify_ = true;
        for(size_t i = 0; i < observers_.size(); i++) {
            observers_[i]->value_changed(value);
        }
        block_notify_ = false;
    }